

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O1

void __thiscall clask::response_writer::set_header(response_writer *this,string *key,string *val)

{
  char cVar1;
  size_type sVar2;
  pointer pcVar3;
  pointer ppVar4;
  size_t __n;
  int iVar5;
  size_type sVar6;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *hh;
  pointer ppVar7;
  bool bVar8;
  string h;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  sVar2 = key->_M_string_length;
  if (sVar2 != 0) {
    sVar6 = 0;
    do {
      if (((sVar6 == 0) || (cVar1 = (key->_M_dataplus)._M_p[sVar6 - 1], cVar1 == '-')) ||
         (cVar1 == ' ')) {
        pcVar3 = (key->_M_dataplus)._M_p;
        iVar5 = toupper((int)pcVar3[sVar6]);
        pcVar3[sVar6] = (char)iVar5;
      }
      sVar6 = sVar6 + 1;
    } while (sVar2 != sVar6);
  }
  std::__cxx11::string::substr((ulong)&local_50,(ulong)key);
  ppVar4 = (this->headers).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar7 = (this->headers).
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar7 != ppVar4; ppVar7 = ppVar7 + 1) {
    __n = (ppVar7->first)._M_string_length;
    if (__n == local_50._M_string_length) {
      if (__n == 0) {
        bVar8 = true;
      }
      else {
        iVar5 = bcmp((ppVar7->first)._M_dataplus._M_p,local_50._M_dataplus._M_p,__n);
        bVar8 = iVar5 == 0;
      }
    }
    else {
      bVar8 = false;
    }
    if (bVar8) {
      std::__cxx11::string::_M_assign((string *)&ppVar7->second);
      if (bVar8) goto LAB_0010a5bb;
    }
  }
  std::
  vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string_const&>
            ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
              *)&this->headers,&local_50,val);
LAB_0010a5bb:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

inline void response_writer::set_header(std::string key, const std::string& val) {
  auto h = camelize(key);
  for (auto& hh : headers) {
    if (hh.first == h) {
      hh.second = val;
      return;
    }
  }
  headers.emplace_back(h, val);
}